

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O2

string * __thiscall
t_xsd_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_xsd_generator *this,t_type *ttype)

{
  _func_int **pp_Var1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var_00;
  t_xsd_generator *this_00;
  string *this_01;
  allocator local_59;
  string local_58;
  string local_38;
  undefined4 extraout_var;
  
  this_00 = this;
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
  pp_Var1 = (ttype->super_t_doc)._vptr_t_doc;
  if ((char)iVar2 == '\0') {
    iVar2 = (*pp_Var1[5])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
        if (((char)iVar2 == '\0') &&
           (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar2 == '\0')) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,"container",&local_59);
          return __return_storage_ptr__;
        }
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        psVar3 = (string *)CONCAT44(extraout_var_00,iVar2);
        goto LAB_002c0dd8;
      }
      std::__cxx11::string::string((string *)&local_58,"int",&local_59);
      xsd(__return_storage_ptr__,this,&local_58);
      this_01 = &local_58;
    }
    else {
      base_type_name_abi_cxx11_(&local_38,this_00,*(t_base *)&ttype[1].super_t_doc._vptr_t_doc);
      xsd(__return_storage_ptr__,this,&local_38);
      this_01 = &local_38;
    }
    std::__cxx11::string::~string((string *)this_01);
  }
  else {
    iVar2 = (*pp_Var1[3])(ttype);
    psVar3 = (string *)CONCAT44(extraout_var,iVar2);
LAB_002c0dd8:
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_xsd_generator::type_name(t_type* ttype) {
  if (ttype->is_typedef()) {
    return ttype->get_name();
  }

  if (ttype->is_base_type()) {
    return xsd(base_type_name(((t_base_type*)ttype)->get_base()));
  }

  if (ttype->is_enum()) {
    return xsd("int");
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    return ttype->get_name();
  }

  return "container";
}